

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall fasttext::Model::negativeSampling(Model *this,int32_t target,real lr)

{
  int32_t target_00;
  int32_t n;
  int iVar1;
  float fVar2;
  real rVar3;
  
  Vector::zero(&this->grad_);
  fVar2 = 0.0;
  for (iVar1 = 0;
      iVar1 <= ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->neg; iVar1 = iVar1 + 1) {
    target_00 = target;
    if (iVar1 != 0) {
      target_00 = getNegative(this,target);
    }
    rVar3 = binaryLogistic(this,target_00,iVar1 == 0,lr);
    fVar2 = fVar2 + rVar3;
  }
  return fVar2;
}

Assistant:

real Model::negativeSampling(int32_t target, real lr) {
  real loss = 0.0;
  grad_.zero();
  for (int32_t n = 0; n <= args_->neg; n++) {
    if (n == 0) {
      loss += binaryLogistic(target, true, lr);
    } else {
      loss += binaryLogistic(getNegative(target), false, lr);
    }
  }
  return loss;
}